

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImNodes.cpp
# Opt level: O0

bool ImNodes::operator==(ImVec2 *a,ImVec2 *b)

{
  int __x;
  float extraout_XMM0_Da;
  float fVar1;
  float extraout_XMM0_Da_00;
  undefined1 local_19;
  ImVec2 *b_local;
  ImVec2 *a_local;
  
  __x = (int)a;
  std::abs(__x);
  fVar1 = std::numeric_limits<float>::epsilon();
  local_19 = false;
  if (extraout_XMM0_Da < fVar1) {
    std::abs(__x);
    fVar1 = std::numeric_limits<float>::epsilon();
    local_19 = extraout_XMM0_Da_00 < fVar1;
  }
  return local_19;
}

Assistant:

bool operator ==(const ImVec2& a, const ImVec2& b)
{
    return abs(a.x - b.x) < std::numeric_limits<float>::epsilon() &&
           abs(a.y - b.y) < std::numeric_limits<float>::epsilon();
}